

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O1

void __thiscall dlib::button::~button(button *this)

{
  ~button(this);
  operator_delete(this);
  return;
}

Assistant:

~button() { disable_events(); parent.invalidate_rectangle(style->get_invalidation_rect(rect)); }